

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editorrenderer.cpp
# Opt level: O1

void __thiscall EditorRenderer::~EditorRenderer(EditorRenderer *this)

{
  Renderer *this_00;
  ulong uVar1;
  undefined1 local_48 [8];
  vector<Entity_*,_std::allocator<Entity_*>_> entities;
  vector<Light_*,_std::allocator<Light_*>_> lights;
  
  (this->super_Fl_Gl_Window).super_Fl_Window.super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget =
       (_func_int **)&PTR__EditorRenderer_0024c570;
  std::vector<Entity_*,_std::allocator<Entity_*>_>::vector
            ((vector<Entity_*,_std::allocator<Entity_*>_> *)local_48,&this->editorScene->entities);
  if ((undefined1  [8])
      entities.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
      super__Vector_impl_data._M_start != local_48) {
    uVar1 = 0;
    do {
      if (*(pointer)((long)local_48 + uVar1 * 8) != (Entity *)0x0) {
        (*(*(pointer)((long)local_48 + uVar1 * 8))->_vptr_Entity[1])();
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < (ulong)((long)entities.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start - (long)local_48 >> 3));
  }
  std::vector<Light_*,_std::allocator<Light_*>_>::vector
            ((vector<Light_*,_std::allocator<Light_*>_> *)
             &entities.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&this->editorScene->lights);
  if (lights.super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (pointer)entities.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
    uVar1 = 0;
    do {
      if (entities.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[uVar1] != (Entity *)0x0) {
        (*entities.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[uVar1]->_vptr_Entity[1])();
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < (ulong)((long)lights.super__Vector_base<Light_*,_std::allocator<Light_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start -
                             (long)entities.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage >> 3));
  }
  if (this->editorScene != (Scene *)0x0) {
    (*this->editorScene->_vptr_Scene[1])();
  }
  this_00 = this->engineRenderer;
  if (this_00 != (Renderer *)0x0) {
    Renderer::~Renderer(this_00);
    operator_delete(this_00);
  }
  if (this->unlitMaterial != (Material *)0x0) {
    (*this->unlitMaterial->_vptr_Material[1])();
  }
  if (this->unlitShader != (Shader *)0x0) {
    (*this->unlitShader->_vptr_Shader[1])();
  }
  ManyMouse_Quit();
  if (entities.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(entities.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (local_48 != (undefined1  [8])0x0) {
    operator_delete((void *)local_48);
  }
  Fl_Gl_Window::~Fl_Gl_Window(&this->super_Fl_Gl_Window);
  return;
}

Assistant:

EditorRenderer::~EditorRenderer()
{
	std::vector<Entity*> entities = editorScene->getEntities();

	for (int i = 0; i < entities.size(); i++)
	{
		delete entities[i];
	}

	std::vector<Light*> lights = editorScene->getLights();

	for (int i = 0; i < lights.size(); i++)
	{
		delete lights[i];
	}

	delete editorScene;
	delete engineRenderer;
	delete unlitMaterial;
	delete unlitShader;
	ManyMouse_Quit();
}